

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void lj_asm_trace(jit_State *J,GCtrace *T)

{
  uint uVar1;
  TraceError TVar2;
  IRIns *pIVar3;
  int iVar4;
  GCtrace *T_00;
  IRIns *pIVar5;
  GCtrace *pGVar6;
  MCode *end;
  long in_RSI;
  jit_State *in_RDI;
  bool bVar7;
  IRIns *ir_1;
  IRIns *ir;
  IRRef nins;
  ASMState *as;
  ASMState as_;
  IRRef ref;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  TraceError e;
  jit_State *in_stack_fffffffffffffc00;
  jit_State *J_00;
  jit_State *J_01;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  IRIns *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc20;
  ASMState *in_stack_fffffffffffffc38;
  ASMState *in_stack_fffffffffffffc50;
  jit_State *as_00;
  RegSet local_328;
  uint local_308;
  uint local_304;
  MCode *local_2b0;
  
  iVar4 = *(int *)(in_RSI + 8);
  T_00 = (GCtrace *)(*(long *)(in_RSI + 0x10) + (ulong)(iVar4 - 1) * 8);
  pGVar6 = T_00;
  if ((T_00->gct == '\f') || (T_00->gct == '\x14')) {
    do {
      T_00 = (GCtrace *)&pGVar6[-1].nextside;
      iVar4 = iVar4 + -1;
      bVar7 = true;
      if (pGVar6[-1].unused1 != '\f') {
        bVar7 = pGVar6[-1].unused1 == '\x14';
      }
      pGVar6 = T_00;
    } while (bVar7);
    *(int *)(in_RSI + 8) = iVar4;
    in_stack_fffffffffffffc0f = 0;
  }
  uVar1 = (in_RDI->cur).nins;
  if (in_RDI->irtoplim <= uVar1) {
    lj_ir_growtop(in_stack_fffffffffffffc00);
  }
  (in_RDI->cur).nins = uVar1 + 1;
  pIVar5 = (in_RDI->cur).ir + uVar1;
  (pIVar5->field_0).ot = 0xc00;
  (pIVar5->field_0).op2 = 0;
  (pIVar5->field_0).op1 = 0;
  (pIVar5->field_0).prev = 0;
  as_00 = in_RDI;
  pGVar6 = lj_trace_alloc((lua_State *)CONCAT44(iVar4,in_stack_fffffffffffffc20),T_00);
  in_RDI->curfinal = pGVar6;
  pIVar5 = *(IRIns **)&in_RDI->flags;
  TVar2 = in_RDI->loopref;
  if (in_RDI->parent == 0) {
    J_00 = (jit_State *)0x0;
  }
  else {
    J_00 = (jit_State *)(ulong)in_RDI->trace[in_RDI->parent].gcptr32;
  }
  J_01 = J_00;
  end = lj_mcode_reserve(J_00,(MCode **)
                              CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  asm_setup_target((ASMState *)0x1608cc);
  while( true ) {
    pIVar3 = in_RDI->curfinal->ir;
    (in_RDI->cur).nins = uVar1;
    asm_tail_prep((ASMState *)&stack0xfffffffffffffc30);
    e = TVar2;
    if (((ulong)pIVar5 & 0x2000000) == 0) {
      e = ~LJ_TRERR_RECERR;
    }
    asm_setup_regsp(in_stack_fffffffffffffc50);
    local_308 = uVar1;
    if (TVar2 == LJ_TRERR_RECERR) {
      asm_tail_link(in_stack_fffffffffffffc38);
    }
    while (local_308 = local_308 - 1, local_304 < local_308) {
      in_stack_fffffffffffffc10 = pIVar3 + local_308;
      asm_snap_prev((ASMState *)J_01);
      if ((((((in_stack_fffffffffffffc10->field_1).r & 0x80) == 0) ||
           ((in_stack_fffffffffffffc10->field_1).s != '\0')) ||
          (0x5f < (((in_stack_fffffffffffffc10->field_1).t.irt | 0x7f) &
                  lj_ir_mode[(in_stack_fffffffffffffc10->field_1).o]))) ||
         (((ulong)pIVar5 & 0x40000) == 0)) {
        if (((in_stack_fffffffffffffc10->field_1).t.irt & 0x80) != 0) {
          asm_snap_prep((ASMState *)J_01);
        }
        if (end < local_2b0 + 0x40) {
          asm_mclimit((ASMState *)0x160b1d);
        }
        asm_ir((ASMState *)&in_stack_fffffffffffffc10->field_0,
               (IRIns *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
      }
    }
    if (end < local_2b0 + 0x40) {
      asm_mclimit((ASMState *)0x160bb6);
    }
    ra_evictk((ASMState *)&in_stack_fffffffffffffc10->field_0);
    if (J_00 == (jit_State *)0x0) {
      asm_head_root((ASMState *)J_01);
    }
    else {
      asm_head_side((ASMState *)as_00);
    }
    asm_phi_fixup((ASMState *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
    if (*(uint *)(in_RSI + 8) <= in_RDI->curfinal->nins) break;
    lj_trace_free((global_State *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
                  &J_01->cur);
    in_RDI->curfinal = (GCtrace *)0x0;
    pGVar6 = lj_trace_alloc((lua_State *)CONCAT44(iVar4,in_stack_fffffffffffffc20),T_00);
    in_RDI->curfinal = pGVar6;
  }
  memcpy(in_RDI->curfinal->ir + uVar1,(void *)(*(long *)(in_RSI + 0x10) + (ulong)uVar1 * 8),
         (ulong)(*(int *)(in_RSI + 8) - uVar1) << 3);
  *(IRRef *)(in_RSI + 8) = in_RDI->curfinal->nins;
  asm_snap_prev((ASMState *)J_01);
  if (local_328 == 0xffffffef) {
    *(MCode **)(in_RSI + 0x40) = end;
    *(undefined4 *)(in_RSI + 0x48) = 0;
    if (TVar2 == LJ_TRERR_RECERR) {
      asm_tail_fixup((ASMState *)&stack0xfffffffffffffc30,(uint)*(ushort *)(in_RSI + 0x52));
    }
    *(undefined4 *)(in_RSI + 0x3c) = 0;
    asm_snap_fixup_mcofs((ASMState *)&stack0xfffffffffffffc30);
    lj_mcode_sync(*(void **)(in_RSI + 0x40),end);
    return;
  }
  lj_trace_err(J_01,e);
}

Assistant:

void lj_asm_trace(jit_State *J, GCtrace *T)
{
  ASMState as_;
  ASMState *as = &as_;

  /* Remove nops/renames left over from ASM restart due to LJ_TRERR_MCODELM. */
  {
    IRRef nins = T->nins;
    IRIns *ir = &T->ir[nins-1];
    if (ir->o == IR_NOP || ir->o == IR_RENAME) {
      do { ir--; nins--; } while (ir->o == IR_NOP || ir->o == IR_RENAME);
      T->nins = nins;
    }
  }

  /* Ensure an initialized instruction beyond the last one for HIOP checks. */
  /* This also allows one RENAME to be added without reallocating curfinal. */
  as->orignins = lj_ir_nextins(J);
  lj_ir_nop(&J->cur.ir[as->orignins]);

  /* Setup initial state. Copy some fields to reduce indirections. */
  as->J = J;
  as->T = T;
  J->curfinal = lj_trace_alloc(J->L, T);  /* This copies the IR, too. */
  as->flags = J->flags;
  as->loopref = J->loopref;
  as->realign = NULL;
  as->loopinv = 0;
  as->parent = J->parent ? traceref(J, J->parent) : NULL;

  /* Reserve MCode memory. */
  as->mctop = as->mctoporig = lj_mcode_reserve(J, &as->mcbot);
  as->mcp = as->mctop;
  as->mclim = as->mcbot + MCLIM_REDZONE;
  asm_setup_target(as);

  /*
  ** This is a loop, because the MCode may have to be (re-)assembled
  ** multiple times:
  **
  ** 1. as->realign is set (and the assembly aborted), if the arch-specific
  **    backend wants the MCode to be aligned differently.
  **
  **    This is currently only the case on x86/x64, where small loops get
  **    an aligned loop body plus a short branch. Not much effort is wasted,
  **    because the abort happens very quickly and only once.
  **
  ** 2. The IR is immovable, since the MCode embeds pointers to various
  **    constants inside the IR. But RENAMEs may need to be added to the IR
  **    during assembly, which might grow and reallocate the IR. We check
  **    at the end if the IR (in J->cur.ir) has actually grown, resize the
  **    copy (in J->curfinal.ir) and try again.
  **
  **    95% of all traces have zero RENAMEs, 3% have one RENAME, 1.5% have
  **    2 RENAMEs and only 0.5% have more than that. That's why we opt to
  **    always have one spare slot in the IR (see above), which means we
  **    have to redo the assembly for only ~2% of all traces.
  **
  **    Very, very rarely, this needs to be done repeatedly, since the
  **    location of constants inside the IR (actually, reachability from
  **    a global pointer) may affect register allocation and thus the
  **    number of RENAMEs.
  */
  for (;;) {
    as->mcp = as->mctop;
#ifdef LUA_USE_ASSERT
    as->mcp_prev = as->mcp;
#endif
    as->ir = J->curfinal->ir;  /* Use the copied IR. */
    as->curins = J->cur.nins = as->orignins;

    RA_DBG_START();
    RA_DBGX((as, "===== STOP ====="));

    /* General trace setup. Emit tail of trace. */
    asm_tail_prep(as);
    as->mcloop = NULL;
    as->flagmcp = NULL;
    as->topslot = 0;
    as->gcsteps = 0;
    as->sectref = as->loopref;
    as->fuseref = (as->flags & JIT_F_OPT_FUSE) ? as->loopref : FUSE_DISABLED;
    asm_setup_regsp(as);
    if (!as->loopref)
      asm_tail_link(as);

    /* Assemble a trace in linear backwards order. */
    for (as->curins--; as->curins > as->stopins; as->curins--) {
      IRIns *ir = IR(as->curins);
      /* 64 bit types handled by SPLIT for 32 bit archs. */
      lj_assertA(!(LJ_32 && irt_isint64(ir->t)),
		 "IR %04d has unsplit 64 bit type",
		 (int)(ir - as->ir) - REF_BIAS);
      asm_snap_prev(as);
      if (!ra_used(ir) && !ir_sideeff(ir) && (as->flags & JIT_F_OPT_DCE))
	continue;  /* Dead-code elimination can be soooo easy. */
      if (irt_isguard(ir->t))
	asm_snap_prep(as);
      RA_DBG_REF();
      checkmclim(as);
      asm_ir(as, ir);
    }

    if (as->realign && J->curfinal->nins >= T->nins)
      continue;  /* Retry in case only the MCode needs to be realigned. */

    /* Emit head of trace. */
    RA_DBG_REF();
    checkmclim(as);
    if (as->gcsteps > 0) {
      as->curins = as->T->snap[0].ref;
      asm_snap_prep(as);  /* The GC check is a guard. */
      asm_gc_check(as);
      as->curins = as->stopins;
    }
    ra_evictk(as);
    if (as->parent)
      asm_head_side(as);
    else
      asm_head_root(as);
    asm_phi_fixup(as);

    if (J->curfinal->nins >= T->nins) {  /* IR didn't grow? */
      lj_assertA(J->curfinal->nk == T->nk, "unexpected IR constant growth");
      memcpy(J->curfinal->ir + as->orignins, T->ir + as->orignins,
	     (T->nins - as->orignins) * sizeof(IRIns));  /* Copy RENAMEs. */
      T->nins = J->curfinal->nins;
      /* Fill mcofs of any unprocessed snapshots. */
      as->curins = REF_FIRST;
      asm_snap_prev(as);
      break;  /* Done. */
    }

    /* Otherwise try again with a bigger IR. */
    lj_trace_free(J2G(J), J->curfinal);
    J->curfinal = NULL;  /* In case lj_trace_alloc() OOMs. */
    J->curfinal = lj_trace_alloc(J->L, T);
    as->realign = NULL;
  }

  RA_DBGX((as, "===== START ===="));
  RA_DBG_FLUSH();
  if (as->freeset != RSET_ALL)
    lj_trace_err(as->J, LJ_TRERR_BADRA);  /* Ouch! Should never happen. */

  /* Set trace entry point before fixing up tail to allow link to self. */
  T->mcode = as->mcp;
  T->mcloop = as->mcloop ? (MSize)((char *)as->mcloop - (char *)as->mcp) : 0;
  if (!as->loopref)
    asm_tail_fixup(as, T->link);  /* Note: this may change as->mctop! */
  T->szmcode = (MSize)((char *)as->mctop - (char *)as->mcp);
  asm_snap_fixup_mcofs(as);
#if LJ_TARGET_MCODE_FIXUP
  asm_mcode_fixup(T->mcode, T->szmcode);
#endif
  lj_mcode_sync(T->mcode, as->mctoporig);
}